

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

string * __thiscall
EOPlus::Parser::ParseQuestName_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  int line_;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  Parser_Error *this_00;
  Token *t_00;
  allocator<char> local_181;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Token t;
  undefined1 local_b0 [64];
  Token local_70;
  
  util::variant::variant((variant *)local_b0);
  Token::Token(&t,Invalid,(variant *)local_b0);
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  bVar3 = GetToken(this,&t,2);
  if (bVar3) {
    util::variant::GetString_abi_cxx11_(__return_storage_ptr__,&t.data);
    std::__cxx11::string::~string((string *)&t.data.val_string);
    return __return_storage_ptr__;
  }
  this_00 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Expected string after \'questname\'.",&local_181);
  std::operator+(&local_140,&local_160," Got: ");
  Token::Token(&local_70,
               &((this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                reject_token);
  token_got_string_abi_cxx11_(&local_180,(EOPlus *)&local_70,t_00);
  std::operator+(&local_120,&local_140,&local_180);
  pPVar2 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar1 = pPVar2->line;
  line_ = pPVar2->reject_line;
  if (line_ < iVar1) {
    line_ = iVar1;
  }
  Parser_Error::Parser_Error(this_00,&local_120,line_);
  __cxa_throw(this_00,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Parser::ParseQuestName()
	{
		Token t;

		if (this->GetToken(t, Token::String))
			return std::string(t.data);

		PARSER_ERROR_GOT("Expected string after 'questname'.");
	}